

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::E_formatter<spdlog::details::null_scoped_padder>::format
          (E_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  unsigned_long_long uVar2;
  char *pcVar3;
  unsigned_long_long value;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  format_int fStack_48;
  
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 / 1000000000;
  value = -uVar2;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  pcVar3 = ::fmt::v6::format_int::format_decimal(&fStack_48,value);
  fStack_48.str_ = pcVar3;
  if (lVar1 < -999999999) {
    fStack_48.str_ = pcVar3 + -1;
    pcVar3[-1] = '-';
  }
  pcVar3 = fStack_48.str_;
  __n = (long)(fStack_48.buffer_ + 0x15) - (long)fStack_48.str_;
  uVar4 = (dest->super_buffer<char>).size_ + __n;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
  }
  if (fStack_48.buffer_ + 0x15 != pcVar3) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar3,__n);
  }
  (dest->super_buffer<char>).size_ = uVar4;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }